

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_data_converter_process_pcm_frames
                    (ma_data_converter *pConverter,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint64 *in_RCX;
  void *in_RDX;
  ma_data_converter *in_RSI;
  long in_RDI;
  void *in_R8;
  void *unaff_retaddr;
  ma_uint64 *in_stack_00002048;
  void *in_stack_00002050;
  ma_uint64 *in_stack_00002058;
  void *in_stack_00002060;
  ma_data_converter *in_stack_00002068;
  ma_uint64 *in_stack_00003080;
  void *in_stack_00003088;
  ma_uint64 *in_stack_00003090;
  void *in_stack_00003098;
  ma_data_converter *in_stack_000030a0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  ma_result mVar1;
  
  if (in_RDI == 0) {
    mVar1 = MA_INVALID_ARGS;
  }
  else {
    switch((ma_uint64 *)(ulong)*(uint *)(in_RDI + 0x1c)) {
    case (ma_uint64 *)0x0:
      mVar1 = ma_data_converter_process_pcm_frames__passthrough
                        (pConverter,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
      break;
    case (ma_uint64 *)0x1:
      mVar1 = ma_data_converter_process_pcm_frames__format_only
                        ((ma_data_converter *)pFrameCountIn,pFramesOut,pFrameCountOut,unaff_retaddr,
                         (ma_uint64 *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8))
      ;
      break;
    case (ma_uint64 *)0x2:
      mVar1 = ma_data_converter_process_pcm_frames__channels_only
                        (in_stack_00002068,in_stack_00002060,in_stack_00002058,in_stack_00002050,
                         in_stack_00002048);
      break;
    case (ma_uint64 *)0x3:
      mVar1 = ma_data_converter_process_pcm_frames__resample_only
                        (in_RSI,in_RDX,in_RCX,in_R8,(ma_uint64 *)(ulong)*(uint *)(in_RDI + 0x1c));
      break;
    case (ma_uint64 *)0x4:
      mVar1 = ma_data_converter_process_pcm_frames__resample_first
                        (in_stack_000030a0,in_stack_00003098,in_stack_00003090,in_stack_00003088,
                         in_stack_00003080);
      break;
    case (ma_uint64 *)0x5:
      mVar1 = ma_data_converter_process_pcm_frames__channels_first
                        (in_stack_000030a0,in_stack_00003098,in_stack_00003090,in_stack_00003088,
                         in_stack_00003080);
      break;
    default:
      mVar1 = MA_INVALID_OPERATION;
    }
  }
  return mVar1;
}

Assistant:

MA_API ma_result ma_data_converter_process_pcm_frames(ma_data_converter* pConverter, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pConverter == NULL) {
        return MA_INVALID_ARGS;
    }

    switch (pConverter->executionPath)
    {
        case ma_data_converter_execution_path_passthrough:    return ma_data_converter_process_pcm_frames__passthrough(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_format_only:    return ma_data_converter_process_pcm_frames__format_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_only:  return ma_data_converter_process_pcm_frames__channels_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_only:  return ma_data_converter_process_pcm_frames__resample_only(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_resample_first: return ma_data_converter_process_pcm_frames__resample_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        case ma_data_converter_execution_path_channels_first: return ma_data_converter_process_pcm_frames__channels_first(pConverter, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
        default: return MA_INVALID_OPERATION;   /* Should never hit this. */
    }
}